

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O1

bool __thiscall
docopt::Optional::match
          (Optional *this,PatternList *left,
          vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
          *collected)

{
  pointer psVar1;
  element_type *peVar2;
  shared_ptr<docopt::Pattern> *pattern;
  pointer psVar3;
  
  psVar1 = (this->super_BranchPattern).fChildren.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->super_BranchPattern).fChildren.
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    peVar2 = (psVar3->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar2->_vptr_Pattern[2])(peVar2,left,collected);
  }
  return true;
}

Assistant:

bool match(PatternList& left, std::vector<std::shared_ptr<LeafPattern>>& collected) const override {
			for(auto const& pattern : fChildren) {
				pattern->match(left, collected);
			}
			return true;
		}